

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxReEnter(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *sel,
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *maxabs,SPxId *id,int nr,bool polish)

{
  bool bVar1;
  int iVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar4;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar5;
  Item *pIVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  long lVar10;
  pointer pnVar11;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar12;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar13;
  pointer pnVar14;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar15;
  uint *puVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  pointer pnVar20;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  pointer pnVar23;
  uint uVar24;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar25;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar26;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  byte bVar27;
  fpclass_type fVar28;
  int32_t iVar29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  long local_270;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_258;
  cpp_dec_float<200U,_int,_void> *local_1d0;
  cpp_dec_float<200U,_int,_void> local_1c8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_140;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar27 = 0;
  local_b8.fpclass = cpp_dec_float_finite;
  local_b8.prec_elem = 0x1c;
  local_b8.data._M_elems[0] = 0;
  local_b8.data._M_elems[1] = 0;
  local_b8.data._M_elems[2] = 0;
  local_b8.data._M_elems[3] = 0;
  local_b8.data._M_elems[4] = 0;
  local_b8.data._M_elems[5] = 0;
  local_b8.data._M_elems[6] = 0;
  local_b8.data._M_elems[7] = 0;
  local_b8.data._M_elems[8] = 0;
  local_b8.data._M_elems[9] = 0;
  local_b8.data._M_elems[10] = 0;
  local_b8.data._M_elems[0xb] = 0;
  local_b8.data._M_elems[0xc] = 0;
  local_b8.data._M_elems[0xd] = 0;
  local_b8.data._M_elems[0xe] = 0;
  local_b8.data._M_elems[0xf] = 0;
  local_b8.data._M_elems[0x10] = 0;
  local_b8.data._M_elems[0x11] = 0;
  local_b8.data._M_elems[0x12] = 0;
  local_b8.data._M_elems[0x13] = 0;
  local_b8.data._M_elems[0x14] = 0;
  local_b8.data._M_elems[0x15] = 0;
  local_b8.data._M_elems[0x16] = 0;
  local_b8.data._M_elems[0x17] = 0;
  local_b8.data._M_elems[0x18] = 0;
  local_b8.data._M_elems[0x19] = 0;
  local_b8.data._M_elems._104_5_ = 0;
  local_b8.data._M_elems[0x1b]._1_3_ = 0;
  local_b8.exp = 0;
  local_b8.neg = false;
  local_138.fpclass = cpp_dec_float_finite;
  local_138.prec_elem = 0x1c;
  local_138.data._M_elems[0] = 0;
  local_138.data._M_elems[1] = 0;
  local_138.data._M_elems[2] = 0;
  local_138.data._M_elems[3] = 0;
  local_138.data._M_elems[4] = 0;
  local_138.data._M_elems[5] = 0;
  local_138.data._M_elems[6] = 0;
  local_138.data._M_elems[7] = 0;
  local_138.data._M_elems[8] = 0;
  local_138.data._M_elems[9] = 0;
  local_138.data._M_elems[10] = 0;
  local_138.data._M_elems[0xb] = 0;
  local_138.data._M_elems[0xc] = 0;
  local_138.data._M_elems[0xd] = 0;
  local_138.data._M_elems[0xe] = 0;
  local_138.data._M_elems[0xf] = 0;
  local_138.data._M_elems[0x10] = 0;
  local_138.data._M_elems[0x11] = 0;
  local_138.data._M_elems[0x12] = 0;
  local_138.data._M_elems[0x13] = 0;
  local_138.data._M_elems[0x14] = 0;
  local_138.data._M_elems[0x15] = 0;
  local_138.data._M_elems[0x16] = 0;
  local_138.data._M_elems[0x17] = 0;
  local_138.data._M_elems[0x18] = 0;
  local_138.data._M_elems[0x19] = 0;
  local_138.data._M_elems._104_5_ = 0;
  local_138.data._M_elems[0x1b]._1_3_ = 0;
  local_138.exp = 0;
  local_138.neg = false;
  pSVar3 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pUVar4 = pSVar3->thePvec;
  this_00 = &pUVar4->thedelta;
  pUVar5 = pSVar3->theCoPvec;
  iVar9 = (id->super_DataKey).info * pSVar3->theRep;
  if (iVar9 < 0) {
    if (0 < pSVar3->theRep *
            ((pSVar3->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.costat)->data[nr]) {
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clearIdx(&pUVar5->thedelta,nr);
      return true;
    }
    pVVar25 = pSVar3->theCoUbound;
    pVVar26 = pSVar3->theCoLbound;
    pnVar11 = (pUVar5->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar16 = (uint *)(pnVar11 + nr);
    pcVar18 = &local_b8;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pcVar18->data)._M_elems[0] = *puVar16;
      puVar16 = puVar16 + 1;
      pcVar18 = (cpp_dec_float<200U,_int,_void> *)((pcVar18->data)._M_elems + 1);
    }
    local_b8.exp = *(int *)((long)(pnVar11 + nr) + 0x70);
    local_b8.neg = *(bool *)((long)(pnVar11 + nr) + 0x74);
    local_b8._120_8_ = *(undefined8 *)((long)(pnVar11 + nr) + 0x78);
    pnVar14 = (pUVar5->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar9 = pnVar14[nr].m_backend.exp;
    bVar1 = pnVar14[nr].m_backend.neg;
    uVar8._0_4_ = pnVar14[nr].m_backend.fpclass;
    uVar8._4_4_ = pnVar14[nr].m_backend.prec_elem;
    local_1d0 = &maxabs->m_backend;
    memmove(&local_138,pnVar14 + nr,0x70);
    local_138.exp = iVar9;
    local_138.neg = bVar1;
    local_138._120_8_ = uVar8;
    if ((fpclass_type)uVar8 == cpp_dec_float_NaN) {
LAB_005c1291:
      pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)(pnVar11 + nr);
      pNVar13 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((pVVar25->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + nr);
      local_258.val.m_backend.fpclass = cpp_dec_float_finite;
      local_258.val.m_backend.prec_elem = 0x1c;
      local_258.val.m_backend.data._M_elems[0] = 0;
      local_258.val.m_backend.data._M_elems[1] = 0;
      local_258.val.m_backend.data._M_elems[2] = 0;
      local_258.val.m_backend.data._M_elems[3] = 0;
      local_258.val.m_backend.data._M_elems[4] = 0;
      local_258.val.m_backend.data._M_elems[5] = 0;
      local_258.val.m_backend.data._M_elems[6] = 0;
      local_258.val.m_backend.data._M_elems[7] = 0;
      local_258.val.m_backend.data._M_elems[8] = 0;
      local_258.val.m_backend.data._M_elems[9] = 0;
      local_258.val.m_backend.data._M_elems[10] = 0;
      local_258.val.m_backend.data._M_elems[0xb] = 0;
      local_258.val.m_backend.data._M_elems[0xc] = 0;
      local_258.val.m_backend.data._M_elems[0xd] = 0;
      local_258.val.m_backend.data._M_elems[0xe] = 0;
      local_258.val.m_backend.data._M_elems[0xf] = 0;
      local_258.val.m_backend.data._M_elems[0x10] = 0;
      local_258.val.m_backend.data._M_elems[0x11] = 0;
      local_258.val.m_backend.data._M_elems[0x12] = 0;
      local_258.val.m_backend.data._M_elems[0x13] = 0;
      local_258.val.m_backend.data._M_elems[0x14] = 0;
      local_258.val.m_backend.data._M_elems[0x15] = 0;
      local_258.val.m_backend.data._M_elems[0x16] = 0;
      local_258.val.m_backend.data._M_elems[0x17] = 0;
      local_258.val.m_backend.data._M_elems[0x18] = 0;
      local_258.val.m_backend.data._M_elems[0x19] = 0;
      local_258.val.m_backend.data._M_elems._104_5_ = 0;
      local_258.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      local_258.val.m_backend.exp = 0;
      local_258.val.m_backend.neg = false;
      if (&local_258 == pNVar12) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  ((cpp_dec_float<200U,_int,_void> *)&local_258,
                   (cpp_dec_float<200U,_int,_void> *)pNVar13);
        if (local_258.val.m_backend.data._M_elems[0] != 0 ||
            local_258.val.m_backend.fpclass != cpp_dec_float_finite) {
LAB_005c1361:
          local_258.val.m_backend.neg = (bool)(local_258.val.m_backend.neg ^ 1);
        }
      }
      else {
        if (&local_258 != pNVar13) goto LAB_005c12df;
LAB_005c14b9:
        local_258.val.m_backend.fpclass = cpp_dec_float_finite;
        local_258.val.m_backend.prec_elem = 0x1c;
        local_258.val.m_backend.neg = false;
        local_258.val.m_backend.exp = 0;
        local_258.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        local_258.val.m_backend.data._M_elems._104_5_ = 0;
        local_258.val.m_backend.data._M_elems[0x18] = 0;
        local_258.val.m_backend.data._M_elems[0x19] = 0;
        local_258.val.m_backend.data._M_elems[0x16] = 0;
        local_258.val.m_backend.data._M_elems[0x17] = 0;
        local_258.val.m_backend.data._M_elems[0x14] = 0;
        local_258.val.m_backend.data._M_elems[0x15] = 0;
        local_258.val.m_backend.data._M_elems[0x12] = 0;
        local_258.val.m_backend.data._M_elems[0x13] = 0;
        local_258.val.m_backend.data._M_elems[0x10] = 0;
        local_258.val.m_backend.data._M_elems[0x11] = 0;
        local_258.val.m_backend.data._M_elems[0xe] = 0;
        local_258.val.m_backend.data._M_elems[0xf] = 0;
        local_258.val.m_backend.data._M_elems[0xc] = 0;
        local_258.val.m_backend.data._M_elems[0xd] = 0;
        local_258.val.m_backend.data._M_elems[10] = 0;
        local_258.val.m_backend.data._M_elems[0xb] = 0;
        local_258.val.m_backend.data._M_elems[8] = 0;
        local_258.val.m_backend.data._M_elems[9] = 0;
        local_258.val.m_backend.data._M_elems[6] = 0;
        local_258.val.m_backend.data._M_elems[7] = 0;
        local_258.val.m_backend.data._M_elems[4] = 0;
        local_258.val.m_backend.data._M_elems[5] = 0;
        local_258.val.m_backend.data._M_elems[2] = 0;
        local_258.val.m_backend.data._M_elems[3] = 0;
        local_258.val.m_backend.data._M_elems[0] = 0;
        local_258.val.m_backend.data._M_elems[1] = 0;
LAB_005c14be:
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  ((cpp_dec_float<200U,_int,_void> *)&local_258,
                   (cpp_dec_float<200U,_int,_void> *)pNVar12);
      }
    }
    else {
      local_1c8.fpclass = cpp_dec_float_finite;
      local_1c8.prec_elem = 0x1c;
      local_1c8.data._M_elems[0] = 0;
      local_1c8.data._M_elems[1] = 0;
      local_1c8.data._M_elems[2] = 0;
      local_1c8.data._M_elems[3] = 0;
      local_1c8.data._M_elems[4] = 0;
      local_1c8.data._M_elems[5] = 0;
      local_1c8.data._M_elems[6] = 0;
      local_1c8.data._M_elems[7] = 0;
      local_1c8.data._M_elems[8] = 0;
      local_1c8.data._M_elems[9] = 0;
      local_1c8.data._M_elems[10] = 0;
      local_1c8.data._M_elems[0xb] = 0;
      local_1c8.data._M_elems[0xc] = 0;
      local_1c8.data._M_elems[0xd] = 0;
      local_1c8.data._M_elems[0xe] = 0;
      local_1c8.data._M_elems[0xf] = 0;
      local_1c8.data._M_elems[0x10] = 0;
      local_1c8.data._M_elems[0x11] = 0;
      local_1c8.data._M_elems[0x12] = 0;
      local_1c8.data._M_elems[0x13] = 0;
      local_1c8.data._M_elems[0x14] = 0;
      local_1c8.data._M_elems[0x15] = 0;
      local_1c8.data._M_elems[0x16] = 0;
      local_1c8.data._M_elems[0x17] = 0;
      local_1c8.data._M_elems[0x18] = 0;
      local_1c8.data._M_elems[0x19] = 0;
      local_1c8.data._M_elems._104_5_ = 0;
      local_1c8.data._M_elems[0x1b]._1_3_ = 0;
      local_1c8.exp = 0;
      local_1c8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_1c8,0.0);
      iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&local_138,&local_1c8);
      pnVar11 = (pUVar5->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (-1 < iVar9) goto LAB_005c1291;
      pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)(pnVar11 + nr);
      pNVar13 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((pVVar26->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + nr);
      local_258.val.m_backend.fpclass = cpp_dec_float_finite;
      local_258.val.m_backend.prec_elem = 0x1c;
      local_258.val.m_backend.data._M_elems[0] = 0;
      local_258.val.m_backend.data._M_elems[1] = 0;
      local_258.val.m_backend.data._M_elems[2] = 0;
      local_258.val.m_backend.data._M_elems[3] = 0;
      local_258.val.m_backend.data._M_elems[4] = 0;
      local_258.val.m_backend.data._M_elems[5] = 0;
      local_258.val.m_backend.data._M_elems[6] = 0;
      local_258.val.m_backend.data._M_elems[7] = 0;
      local_258.val.m_backend.data._M_elems[8] = 0;
      local_258.val.m_backend.data._M_elems[9] = 0;
      local_258.val.m_backend.data._M_elems[10] = 0;
      local_258.val.m_backend.data._M_elems[0xb] = 0;
      local_258.val.m_backend.data._M_elems[0xc] = 0;
      local_258.val.m_backend.data._M_elems[0xd] = 0;
      local_258.val.m_backend.data._M_elems[0xe] = 0;
      local_258.val.m_backend.data._M_elems[0xf] = 0;
      local_258.val.m_backend.data._M_elems[0x10] = 0;
      local_258.val.m_backend.data._M_elems[0x11] = 0;
      local_258.val.m_backend.data._M_elems[0x12] = 0;
      local_258.val.m_backend.data._M_elems[0x13] = 0;
      local_258.val.m_backend.data._M_elems[0x14] = 0;
      local_258.val.m_backend.data._M_elems[0x15] = 0;
      local_258.val.m_backend.data._M_elems[0x16] = 0;
      local_258.val.m_backend.data._M_elems[0x17] = 0;
      local_258.val.m_backend.data._M_elems[0x18] = 0;
      local_258.val.m_backend.data._M_elems[0x19] = 0;
      local_258.val.m_backend.data._M_elems._104_5_ = 0;
      local_258.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      local_258.val.m_backend.exp = 0;
      local_258.val.m_backend.neg = false;
      if (&local_258 != pNVar12) {
        if (&local_258 == pNVar13) goto LAB_005c14b9;
LAB_005c12df:
        local_258.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        local_258.val.m_backend.data._M_elems._104_5_ = 0;
        local_258.val.m_backend.data._M_elems[0x18] = 0;
        local_258.val.m_backend.data._M_elems[0x19] = 0;
        local_258.val.m_backend.data._M_elems[0x16] = 0;
        local_258.val.m_backend.data._M_elems[0x17] = 0;
        local_258.val.m_backend.data._M_elems[0x14] = 0;
        local_258.val.m_backend.data._M_elems[0x15] = 0;
        local_258.val.m_backend.data._M_elems[0x12] = 0;
        local_258.val.m_backend.data._M_elems[0x13] = 0;
        local_258.val.m_backend.data._M_elems[0x10] = 0;
        local_258.val.m_backend.data._M_elems[0x11] = 0;
        local_258.val.m_backend.data._M_elems[0xe] = 0;
        local_258.val.m_backend.data._M_elems[0xf] = 0;
        local_258.val.m_backend.data._M_elems[0xc] = 0;
        local_258.val.m_backend.data._M_elems[0xd] = 0;
        local_258.val.m_backend.data._M_elems[10] = 0;
        local_258.val.m_backend.data._M_elems[0xb] = 0;
        local_258.val.m_backend.data._M_elems[8] = 0;
        local_258.val.m_backend.data._M_elems[9] = 0;
        local_258.val.m_backend.data._M_elems[6] = 0;
        local_258.val.m_backend.data._M_elems[7] = 0;
        local_258.val.m_backend.data._M_elems[4] = 0;
        local_258.val.m_backend.data._M_elems[5] = 0;
        local_258.val.m_backend.data._M_elems[2] = 0;
        local_258.val.m_backend.data._M_elems[3] = 0;
        local_258.val.m_backend.data._M_elems[0] = 0;
        local_258.val.m_backend.data._M_elems[1] = 0;
        pNVar15 = pNVar13;
        pNVar21 = &local_258;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pNVar21->val).m_backend.data._M_elems[0] = (pNVar15->val).m_backend.data._M_elems[0];
          pNVar15 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar15 + (ulong)bVar27 * -8 + 4);
          pNVar21 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar21 + (ulong)bVar27 * -8 + 4);
        }
        local_258.val.m_backend.exp = *(int *)((long)&(pNVar13->val).m_backend + 0x70);
        local_258.val.m_backend.neg = *(bool *)((long)&(pNVar13->val).m_backend + 0x74);
        local_258.val.m_backend._120_8_ = *(undefined8 *)((long)&(pNVar13->val).m_backend + 0x78);
        goto LAB_005c14be;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                ((cpp_dec_float<200U,_int,_void> *)&local_258,
                 (cpp_dec_float<200U,_int,_void> *)pNVar13);
      if (local_258.val.m_backend.data._M_elems[0] != 0 ||
          local_258.val.m_backend.fpclass != cpp_dec_float_finite) goto LAB_005c1361;
    }
    local_1c8.fpclass = cpp_dec_float_finite;
    local_1c8.prec_elem = 0x1c;
    local_1c8.data._M_elems[0] = 0;
    local_1c8.data._M_elems[1] = 0;
    local_1c8.data._M_elems[2] = 0;
    local_1c8.data._M_elems[3] = 0;
    local_1c8.data._M_elems[4] = 0;
    local_1c8.data._M_elems[5] = 0;
    local_1c8.data._M_elems[6] = 0;
    local_1c8.data._M_elems[7] = 0;
    local_1c8.data._M_elems[8] = 0;
    local_1c8.data._M_elems[9] = 0;
    local_1c8.data._M_elems[10] = 0;
    local_1c8.data._M_elems[0xb] = 0;
    local_1c8.data._M_elems[0xc] = 0;
    local_1c8.data._M_elems[0xd] = 0;
    local_1c8.data._M_elems[0xe] = 0;
    local_1c8.data._M_elems[0xf] = 0;
    local_1c8.data._M_elems[0x10] = 0;
    local_1c8.data._M_elems[0x11] = 0;
    local_1c8.data._M_elems[0x12] = 0;
    local_1c8.data._M_elems[0x13] = 0;
    local_1c8.data._M_elems[0x14] = 0;
    local_1c8.data._M_elems[0x15] = 0;
    local_1c8.data._M_elems[0x16] = 0;
    local_1c8.data._M_elems[0x17] = 0;
    local_1c8.data._M_elems[0x18] = 0;
    local_1c8.data._M_elems[0x19] = 0;
    local_1c8.data._M_elems._104_5_ = 0;
    local_1c8.data._M_elems[0x1b]._1_3_ = 0;
    local_1c8.exp = 0;
    local_1c8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_1c8,(cpp_dec_float<200U,_int,_void> *)&local_258,&local_138);
    pcVar18 = &local_1c8;
    pnVar17 = sel;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar17->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
      pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
    }
    (sel->m_backend).exp = local_1c8.exp;
    (sel->m_backend).neg = local_1c8.neg;
    (sel->m_backend).fpclass = local_1c8.fpclass;
    (sel->m_backend).prec_elem = local_1c8.prec_elem;
    goto LAB_005c153d;
  }
  if (iVar9 == 0) {
    return true;
  }
  local_1d0 = &maxabs->m_backend;
  pVVar25 = pSVar3->theUbound;
  pVVar26 = pSVar3->theLbound;
  pIVar6 = (pSVar3->thevectors->set).theitem;
  iVar9 = (pSVar3->thevectors->set).thekey[nr].idx;
  local_1c8.fpclass = cpp_dec_float_finite;
  local_1c8.prec_elem = 0x1c;
  local_1c8.data._M_elems[0] = 0;
  local_1c8.data._M_elems[1] = 0;
  local_1c8.data._M_elems[2] = 0;
  local_1c8.data._M_elems[3] = 0;
  local_1c8.data._M_elems[4] = 0;
  local_1c8.data._M_elems[5] = 0;
  local_1c8.data._M_elems[6] = 0;
  local_1c8.data._M_elems[7] = 0;
  local_1c8.data._M_elems[8] = 0;
  local_1c8.data._M_elems[9] = 0;
  local_1c8.data._M_elems[10] = 0;
  local_1c8.data._M_elems[0xb] = 0;
  local_1c8.data._M_elems[0xc] = 0;
  local_1c8.data._M_elems[0xd] = 0;
  local_1c8.data._M_elems[0xe] = 0;
  local_1c8.data._M_elems[0xf] = 0;
  local_1c8.data._M_elems[0x10] = 0;
  local_1c8.data._M_elems[0x11] = 0;
  local_1c8.data._M_elems[0x12] = 0;
  local_1c8.data._M_elems[0x13] = 0;
  local_1c8.data._M_elems[0x14] = 0;
  local_1c8.data._M_elems[0x15] = 0;
  local_1c8.data._M_elems[0x16] = 0;
  local_1c8.data._M_elems[0x17] = 0;
  local_1c8.data._M_elems[0x18] = 0;
  local_1c8.data._M_elems[0x19] = 0;
  local_1c8.data._M_elems._104_5_ = 0;
  local_1c8.data._M_elems[0x1b]._1_3_ = 0;
  local_1c8.exp = 0;
  local_1c8.neg = false;
  iVar2 = pIVar6[iVar9].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused;
  if (iVar2 < 1) {
    fVar28 = cpp_dec_float_finite;
    iVar29 = 0x1c;
  }
  else {
    pNVar12 = pIVar6[iVar9].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem;
    uVar24 = iVar2 + 1;
    local_140 = this_00;
    do {
      pNVar15 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((pUVar5->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + pNVar12->idx);
      local_258.val.m_backend.fpclass = cpp_dec_float_finite;
      local_258.val.m_backend.prec_elem = 0x1c;
      local_258.val.m_backend.data._M_elems[0] = 0;
      local_258.val.m_backend.data._M_elems[1] = 0;
      local_258.val.m_backend.data._M_elems[2] = 0;
      local_258.val.m_backend.data._M_elems[3] = 0;
      local_258.val.m_backend.data._M_elems[4] = 0;
      local_258.val.m_backend.data._M_elems[5] = 0;
      local_258.val.m_backend.data._M_elems[6] = 0;
      local_258.val.m_backend.data._M_elems[7] = 0;
      local_258.val.m_backend.data._M_elems[8] = 0;
      local_258.val.m_backend.data._M_elems[9] = 0;
      local_258.val.m_backend.data._M_elems[10] = 0;
      local_258.val.m_backend.data._M_elems[0xb] = 0;
      local_258.val.m_backend.data._M_elems[0xc] = 0;
      local_258.val.m_backend.data._M_elems[0xd] = 0;
      local_258.val.m_backend.data._M_elems[0xe] = 0;
      local_258.val.m_backend.data._M_elems[0xf] = 0;
      local_258.val.m_backend.data._M_elems[0x10] = 0;
      local_258.val.m_backend.data._M_elems[0x11] = 0;
      local_258.val.m_backend.data._M_elems[0x12] = 0;
      local_258.val.m_backend.data._M_elems[0x13] = 0;
      local_258.val.m_backend.data._M_elems[0x14] = 0;
      local_258.val.m_backend.data._M_elems[0x15] = 0;
      local_258.val.m_backend.data._M_elems[0x16] = 0;
      local_258.val.m_backend.data._M_elems[0x17] = 0;
      local_258.val.m_backend.data._M_elems[0x18] = 0;
      local_258.val.m_backend.data._M_elems[0x19] = 0;
      local_258.val.m_backend.data._M_elems._104_5_ = 0;
      local_258.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      local_258.val.m_backend.exp = 0;
      local_258.val.m_backend.neg = false;
      pNVar13 = pNVar12;
      if ((&local_258 != pNVar15) && (pNVar13 = pNVar15, pNVar12 != &local_258)) {
        pNVar15 = pNVar12;
        pNVar21 = &local_258;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pNVar21->val).m_backend.data._M_elems[0] = (pNVar15->val).m_backend.data._M_elems[0];
          pNVar15 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar15 + (ulong)bVar27 * -8 + 4);
          pNVar21 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar21 + (ulong)bVar27 * -8 + 4);
        }
        local_258.val.m_backend.exp = (pNVar12->val).m_backend.exp;
        local_258.val.m_backend.neg = (pNVar12->val).m_backend.neg;
        local_258.val.m_backend.fpclass = (pNVar12->val).m_backend.fpclass;
        local_258.val.m_backend.prec_elem = (pNVar12->val).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                ((cpp_dec_float<200U,_int,_void> *)&local_258,
                 (cpp_dec_float<200U,_int,_void> *)pNVar13);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&local_1c8,(cpp_dec_float<200U,_int,_void> *)&local_258);
      pNVar12 = pNVar12 + 1;
      uVar24 = uVar24 - 1;
    } while (1 < uVar24);
    fVar28 = local_1c8.fpclass;
    iVar29 = local_1c8.prec_elem;
    this_00 = local_140;
  }
  bVar1 = local_1c8.neg;
  iVar9 = local_1c8.exp;
  pcVar18 = &local_1c8;
  pNVar12 = &local_258;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pNVar12->val).m_backend.data._M_elems[0] = (pcVar18->data)._M_elems[0];
    pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
    pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((long)pNVar12 + (ulong)bVar27 * -8 + 4);
  }
  pnVar11 = (pUVar4->
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pNVar12 = &local_258;
  pnVar14 = pnVar11 + nr;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    *(uint *)&pnVar14->m_backend = (pNVar12->val).m_backend.data._M_elems[0];
    pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((long)pNVar12 + (ulong)bVar27 * -8 + 4);
    pnVar14 = (pointer)((long)pnVar14 + ((ulong)bVar27 * -2 + 1) * 4);
  }
  *(int *)((long)(pnVar11 + nr) + 0x70) = iVar9;
  *(bool *)((long)(pnVar11 + nr) + 0x74) = bVar1;
  *(ulong *)((long)(pnVar11 + nr) + 0x78) = CONCAT44(iVar29,fVar28);
  pSVar3 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  if (0 < pSVar3->theRep *
          ((pSVar3->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.stat)->data[nr]) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clearIdx(this_00,nr);
    return true;
  }
  pnVar11 = (pUVar4->
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pnVar14 = pnVar11 + nr;
  pcVar18 = &local_b8;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pcVar18->data)._M_elems[0] = *(uint *)&pnVar14->m_backend;
    pnVar14 = (pointer)((long)pnVar14 + ((ulong)bVar27 * -2 + 1) * 4);
    pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
  }
  local_b8.exp = *(int *)((long)(pnVar11 + nr) + 0x70);
  local_b8.neg = *(bool *)((long)(pnVar11 + nr) + 0x74);
  local_b8._120_8_ = *(undefined8 *)((long)(pnVar11 + nr) + 0x78);
  pnVar14 = (pUVar4->thedelta).
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar9 = pnVar14[nr].m_backend.exp;
  bVar1 = pnVar14[nr].m_backend.neg;
  uVar7._0_4_ = pnVar14[nr].m_backend.fpclass;
  uVar7._4_4_ = pnVar14[nr].m_backend.prec_elem;
  memmove(&local_138,pnVar14 + nr,0x70);
  local_138.exp = iVar9;
  local_138.neg = bVar1;
  local_138._120_8_ = uVar7;
  if ((fpclass_type)uVar7 == cpp_dec_float_NaN) {
LAB_005c10e0:
    pNVar13 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)(pnVar11 + nr);
    pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pVVar25->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + nr);
    local_258.val.m_backend.fpclass = cpp_dec_float_finite;
    local_258.val.m_backend.prec_elem = 0x1c;
    local_258.val.m_backend.data._M_elems[0] = 0;
    local_258.val.m_backend.data._M_elems[1] = 0;
    local_258.val.m_backend.data._M_elems[2] = 0;
    local_258.val.m_backend.data._M_elems[3] = 0;
    local_258.val.m_backend.data._M_elems[4] = 0;
    local_258.val.m_backend.data._M_elems[5] = 0;
    local_258.val.m_backend.data._M_elems[6] = 0;
    local_258.val.m_backend.data._M_elems[7] = 0;
    local_258.val.m_backend.data._M_elems[8] = 0;
    local_258.val.m_backend.data._M_elems[9] = 0;
    local_258.val.m_backend.data._M_elems[10] = 0;
    local_258.val.m_backend.data._M_elems[0xb] = 0;
    local_258.val.m_backend.data._M_elems[0xc] = 0;
    local_258.val.m_backend.data._M_elems[0xd] = 0;
    local_258.val.m_backend.data._M_elems[0xe] = 0;
    local_258.val.m_backend.data._M_elems[0xf] = 0;
    local_258.val.m_backend.data._M_elems[0x10] = 0;
    local_258.val.m_backend.data._M_elems[0x11] = 0;
    local_258.val.m_backend.data._M_elems[0x12] = 0;
    local_258.val.m_backend.data._M_elems[0x13] = 0;
    local_258.val.m_backend.data._M_elems[0x14] = 0;
    local_258.val.m_backend.data._M_elems[0x15] = 0;
    local_258.val.m_backend.data._M_elems[0x16] = 0;
    local_258.val.m_backend.data._M_elems[0x17] = 0;
    local_258.val.m_backend.data._M_elems[0x18] = 0;
    local_258.val.m_backend.data._M_elems[0x19] = 0;
    local_258.val.m_backend.data._M_elems._104_5_ = 0;
    local_258.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    local_258.val.m_backend.exp = 0;
    local_258.val.m_backend.neg = false;
    if (&local_258 == pNVar13) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                ((cpp_dec_float<200U,_int,_void> *)&local_258,
                 (cpp_dec_float<200U,_int,_void> *)pNVar12);
      if (local_258.val.m_backend.data._M_elems[0] != 0 ||
          local_258.val.m_backend.fpclass != cpp_dec_float_finite) {
LAB_005c132a:
        local_258.val.m_backend.neg = (bool)(local_258.val.m_backend.neg ^ 1);
      }
    }
    else {
      if (&local_258 != pNVar12) goto LAB_005c114b;
LAB_005c13d9:
      local_258.val.m_backend.fpclass = cpp_dec_float_finite;
      local_258.val.m_backend.prec_elem = 0x1c;
      local_258.val.m_backend.neg = false;
      local_258.val.m_backend.exp = 0;
      local_258.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      local_258.val.m_backend.data._M_elems._104_5_ = 0;
      local_258.val.m_backend.data._M_elems[0x18] = 0;
      local_258.val.m_backend.data._M_elems[0x19] = 0;
      local_258.val.m_backend.data._M_elems[0x16] = 0;
      local_258.val.m_backend.data._M_elems[0x17] = 0;
      local_258.val.m_backend.data._M_elems[0x14] = 0;
      local_258.val.m_backend.data._M_elems[0x15] = 0;
      local_258.val.m_backend.data._M_elems[0x12] = 0;
      local_258.val.m_backend.data._M_elems[0x13] = 0;
      local_258.val.m_backend.data._M_elems[0x10] = 0;
      local_258.val.m_backend.data._M_elems[0x11] = 0;
      local_258.val.m_backend.data._M_elems[0xe] = 0;
      local_258.val.m_backend.data._M_elems[0xf] = 0;
      local_258.val.m_backend.data._M_elems[0xc] = 0;
      local_258.val.m_backend.data._M_elems[0xd] = 0;
      local_258.val.m_backend.data._M_elems[10] = 0;
      local_258.val.m_backend.data._M_elems[0xb] = 0;
      local_258.val.m_backend.data._M_elems[8] = 0;
      local_258.val.m_backend.data._M_elems[9] = 0;
      local_258.val.m_backend.data._M_elems[6] = 0;
      local_258.val.m_backend.data._M_elems[7] = 0;
      local_258.val.m_backend.data._M_elems[4] = 0;
      local_258.val.m_backend.data._M_elems[5] = 0;
      local_258.val.m_backend.data._M_elems[2] = 0;
      local_258.val.m_backend.data._M_elems[3] = 0;
      local_258.val.m_backend.data._M_elems[0] = 0;
      local_258.val.m_backend.data._M_elems[1] = 0;
LAB_005c13de:
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                ((cpp_dec_float<200U,_int,_void> *)&local_258,
                 (cpp_dec_float<200U,_int,_void> *)pNVar13);
    }
  }
  else {
    local_1c8.fpclass = cpp_dec_float_finite;
    local_1c8.prec_elem = 0x1c;
    local_1c8.data._M_elems[0] = 0;
    local_1c8.data._M_elems[1] = 0;
    local_1c8.data._M_elems[2] = 0;
    local_1c8.data._M_elems[3] = 0;
    local_1c8.data._M_elems[4] = 0;
    local_1c8.data._M_elems[5] = 0;
    local_1c8.data._M_elems[6] = 0;
    local_1c8.data._M_elems[7] = 0;
    local_1c8.data._M_elems[8] = 0;
    local_1c8.data._M_elems[9] = 0;
    local_1c8.data._M_elems[10] = 0;
    local_1c8.data._M_elems[0xb] = 0;
    local_1c8.data._M_elems[0xc] = 0;
    local_1c8.data._M_elems[0xd] = 0;
    local_1c8.data._M_elems[0xe] = 0;
    local_1c8.data._M_elems[0xf] = 0;
    local_1c8.data._M_elems[0x10] = 0;
    local_1c8.data._M_elems[0x11] = 0;
    local_1c8.data._M_elems[0x12] = 0;
    local_1c8.data._M_elems[0x13] = 0;
    local_1c8.data._M_elems[0x14] = 0;
    local_1c8.data._M_elems[0x15] = 0;
    local_1c8.data._M_elems[0x16] = 0;
    local_1c8.data._M_elems[0x17] = 0;
    local_1c8.data._M_elems[0x18] = 0;
    local_1c8.data._M_elems[0x19] = 0;
    local_1c8.data._M_elems._104_5_ = 0;
    local_1c8.data._M_elems[0x1b]._1_3_ = 0;
    local_1c8.exp = 0;
    local_1c8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_1c8,0.0);
    iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&local_138,&local_1c8);
    pnVar11 = (pUVar4->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (-1 < iVar9) goto LAB_005c10e0;
    pNVar13 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)(pnVar11 + nr);
    pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pVVar26->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + nr);
    local_258.val.m_backend.fpclass = cpp_dec_float_finite;
    local_258.val.m_backend.prec_elem = 0x1c;
    local_258.val.m_backend.data._M_elems[0] = 0;
    local_258.val.m_backend.data._M_elems[1] = 0;
    local_258.val.m_backend.data._M_elems[2] = 0;
    local_258.val.m_backend.data._M_elems[3] = 0;
    local_258.val.m_backend.data._M_elems[4] = 0;
    local_258.val.m_backend.data._M_elems[5] = 0;
    local_258.val.m_backend.data._M_elems[6] = 0;
    local_258.val.m_backend.data._M_elems[7] = 0;
    local_258.val.m_backend.data._M_elems[8] = 0;
    local_258.val.m_backend.data._M_elems[9] = 0;
    local_258.val.m_backend.data._M_elems[10] = 0;
    local_258.val.m_backend.data._M_elems[0xb] = 0;
    local_258.val.m_backend.data._M_elems[0xc] = 0;
    local_258.val.m_backend.data._M_elems[0xd] = 0;
    local_258.val.m_backend.data._M_elems[0xe] = 0;
    local_258.val.m_backend.data._M_elems[0xf] = 0;
    local_258.val.m_backend.data._M_elems[0x10] = 0;
    local_258.val.m_backend.data._M_elems[0x11] = 0;
    local_258.val.m_backend.data._M_elems[0x12] = 0;
    local_258.val.m_backend.data._M_elems[0x13] = 0;
    local_258.val.m_backend.data._M_elems[0x14] = 0;
    local_258.val.m_backend.data._M_elems[0x15] = 0;
    local_258.val.m_backend.data._M_elems[0x16] = 0;
    local_258.val.m_backend.data._M_elems[0x17] = 0;
    local_258.val.m_backend.data._M_elems[0x18] = 0;
    local_258.val.m_backend.data._M_elems[0x19] = 0;
    local_258.val.m_backend.data._M_elems._104_5_ = 0;
    local_258.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    local_258.val.m_backend.exp = 0;
    local_258.val.m_backend.neg = false;
    if (&local_258 != pNVar13) {
      if (&local_258 == pNVar12) goto LAB_005c13d9;
LAB_005c114b:
      local_258.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      local_258.val.m_backend.data._M_elems._104_5_ = 0;
      local_258.val.m_backend.data._M_elems[0x18] = 0;
      local_258.val.m_backend.data._M_elems[0x19] = 0;
      local_258.val.m_backend.data._M_elems[0x16] = 0;
      local_258.val.m_backend.data._M_elems[0x17] = 0;
      local_258.val.m_backend.data._M_elems[0x14] = 0;
      local_258.val.m_backend.data._M_elems[0x15] = 0;
      local_258.val.m_backend.data._M_elems[0x12] = 0;
      local_258.val.m_backend.data._M_elems[0x13] = 0;
      local_258.val.m_backend.data._M_elems[0x10] = 0;
      local_258.val.m_backend.data._M_elems[0x11] = 0;
      local_258.val.m_backend.data._M_elems[0xe] = 0;
      local_258.val.m_backend.data._M_elems[0xf] = 0;
      local_258.val.m_backend.data._M_elems[0xc] = 0;
      local_258.val.m_backend.data._M_elems[0xd] = 0;
      local_258.val.m_backend.data._M_elems[10] = 0;
      local_258.val.m_backend.data._M_elems[0xb] = 0;
      local_258.val.m_backend.data._M_elems[8] = 0;
      local_258.val.m_backend.data._M_elems[9] = 0;
      local_258.val.m_backend.data._M_elems[6] = 0;
      local_258.val.m_backend.data._M_elems[7] = 0;
      local_258.val.m_backend.data._M_elems[4] = 0;
      local_258.val.m_backend.data._M_elems[5] = 0;
      local_258.val.m_backend.data._M_elems[2] = 0;
      local_258.val.m_backend.data._M_elems[3] = 0;
      local_258.val.m_backend.data._M_elems[0] = 0;
      local_258.val.m_backend.data._M_elems[1] = 0;
      pNVar15 = pNVar12;
      pNVar21 = &local_258;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pNVar21->val).m_backend.data._M_elems[0] = (pNVar15->val).m_backend.data._M_elems[0];
        pNVar15 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar15 + (ulong)bVar27 * -8 + 4);
        pNVar21 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar21 + (ulong)bVar27 * -8 + 4);
      }
      local_258.val.m_backend.exp = *(int *)((long)&(pNVar12->val).m_backend + 0x70);
      local_258.val.m_backend.neg = *(bool *)((long)&(pNVar12->val).m_backend + 0x74);
      local_258.val.m_backend._120_8_ = *(undefined8 *)((long)&(pNVar12->val).m_backend + 0x78);
      goto LAB_005c13de;
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              ((cpp_dec_float<200U,_int,_void> *)&local_258,
               (cpp_dec_float<200U,_int,_void> *)pNVar12);
    if (local_258.val.m_backend.data._M_elems[0] != 0 ||
        local_258.val.m_backend.fpclass != cpp_dec_float_finite) goto LAB_005c132a;
  }
  local_1c8.fpclass = cpp_dec_float_finite;
  local_1c8.prec_elem = 0x1c;
  local_1c8.data._M_elems[0] = 0;
  local_1c8.data._M_elems[1] = 0;
  local_1c8.data._M_elems[2] = 0;
  local_1c8.data._M_elems[3] = 0;
  local_1c8.data._M_elems[4] = 0;
  local_1c8.data._M_elems[5] = 0;
  local_1c8.data._M_elems[6] = 0;
  local_1c8.data._M_elems[7] = 0;
  local_1c8.data._M_elems[8] = 0;
  local_1c8.data._M_elems[9] = 0;
  local_1c8.data._M_elems[10] = 0;
  local_1c8.data._M_elems[0xb] = 0;
  local_1c8.data._M_elems[0xc] = 0;
  local_1c8.data._M_elems[0xd] = 0;
  local_1c8.data._M_elems[0xe] = 0;
  local_1c8.data._M_elems[0xf] = 0;
  local_1c8.data._M_elems[0x10] = 0;
  local_1c8.data._M_elems[0x11] = 0;
  local_1c8.data._M_elems[0x12] = 0;
  local_1c8.data._M_elems[0x13] = 0;
  local_1c8.data._M_elems[0x14] = 0;
  local_1c8.data._M_elems[0x15] = 0;
  local_1c8.data._M_elems[0x16] = 0;
  local_1c8.data._M_elems[0x17] = 0;
  local_1c8.data._M_elems[0x18] = 0;
  local_1c8.data._M_elems[0x19] = 0;
  local_1c8.data._M_elems._104_5_ = 0;
  local_1c8.data._M_elems[0x1b]._1_3_ = 0;
  local_1c8.exp = 0;
  local_1c8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&local_1c8,(cpp_dec_float<200U,_int,_void> *)&local_258,&local_138);
  pcVar18 = &local_1c8;
  pnVar17 = sel;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pnVar17->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
    pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
    pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
  }
  (sel->m_backend).exp = local_1c8.exp;
  (sel->m_backend).neg = local_1c8.neg;
  (sel->m_backend).fpclass = local_1c8.fpclass;
  (sel->m_backend).prec_elem = local_1c8.prec_elem;
LAB_005c153d:
  local_270 = (long)nr;
  pnVar11 = (pVVar25->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((pnVar11[local_270].m_backend.fpclass == cpp_dec_float_NaN) ||
      (pnVar14 = (pVVar26->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
      pnVar14[local_270].m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&pnVar11[local_270].m_backend,&pnVar14[local_270].m_backend), iVar9 != 0))
  {
    pnVar17 = &this->fastDelta;
    pNVar12 = &local_258;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pNVar12->val).m_backend.data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + (ulong)bVar27 * -8 + 4);
      pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((long)pNVar12 + (ulong)bVar27 * -8 + 4);
    }
    local_258.val.m_backend.exp = (this->fastDelta).m_backend.exp;
    local_258.val.m_backend.neg = (this->fastDelta).m_backend.neg;
    local_258.val.m_backend.fpclass = (this->fastDelta).m_backend.fpclass;
    local_258.val.m_backend.prec_elem = (this->fastDelta).m_backend.prec_elem;
    if (local_258.val.m_backend.fpclass != cpp_dec_float_finite ||
        local_258.val.m_backend.data._M_elems[0] != 0) {
      local_258.val.m_backend.neg = (bool)(local_258.val.m_backend.neg ^ 1);
    }
    local_1c8.fpclass = cpp_dec_float_finite;
    local_1c8.prec_elem = 0x1c;
    local_1c8.data._M_elems[0] = 0;
    local_1c8.data._M_elems[1] = 0;
    local_1c8.data._M_elems[2] = 0;
    local_1c8.data._M_elems[3] = 0;
    local_1c8.data._M_elems[4] = 0;
    local_1c8.data._M_elems[5] = 0;
    local_1c8.data._M_elems[6] = 0;
    local_1c8.data._M_elems[7] = 0;
    local_1c8.data._M_elems[8] = 0;
    local_1c8.data._M_elems[9] = 0;
    local_1c8.data._M_elems[10] = 0;
    local_1c8.data._M_elems[0xb] = 0;
    local_1c8.data._M_elems[0xc] = 0;
    local_1c8.data._M_elems[0xd] = 0;
    local_1c8.data._M_elems[0xe] = 0;
    local_1c8.data._M_elems[0xf] = 0;
    local_1c8.data._M_elems[0x10] = 0;
    local_1c8.data._M_elems[0x11] = 0;
    local_1c8.data._M_elems[0x12] = 0;
    local_1c8.data._M_elems[0x13] = 0;
    local_1c8.data._M_elems[0x14] = 0;
    local_1c8.data._M_elems[0x15] = 0;
    local_1c8.data._M_elems[0x16] = 0;
    local_1c8.data._M_elems[0x17] = 0;
    local_1c8.data._M_elems[0x18] = 0;
    local_1c8.data._M_elems[0x19] = 0;
    local_1c8.data._M_elems._104_5_ = 0;
    local_1c8.data._M_elems[0x1b]._1_3_ = 0;
    local_1c8.exp = 0;
    local_1c8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_1c8,(cpp_dec_float<200U,_int,_void> *)&local_258,local_1d0);
    if ((((sel->m_backend).fpclass != cpp_dec_float_NaN) && (local_1c8.fpclass != cpp_dec_float_NaN)
        ) && ((iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&sel->m_backend,&local_1c8), iVar9 < 0 &&
              (boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                         ((cpp_dec_float<200u,int,void> *)sel,0.0), !polish)))) {
      if (local_138.fpclass != cpp_dec_float_NaN) {
        local_1c8.fpclass = cpp_dec_float_finite;
        local_1c8.prec_elem = 0x1c;
        local_1c8.data._M_elems[0] = 0;
        local_1c8.data._M_elems[1] = 0;
        local_1c8.data._M_elems[2] = 0;
        local_1c8.data._M_elems[3] = 0;
        local_1c8.data._M_elems[4] = 0;
        local_1c8.data._M_elems[5] = 0;
        local_1c8.data._M_elems[6] = 0;
        local_1c8.data._M_elems[7] = 0;
        local_1c8.data._M_elems[8] = 0;
        local_1c8.data._M_elems[9] = 0;
        local_1c8.data._M_elems[10] = 0;
        local_1c8.data._M_elems[0xb] = 0;
        local_1c8.data._M_elems[0xc] = 0;
        local_1c8.data._M_elems[0xd] = 0;
        local_1c8.data._M_elems[0xe] = 0;
        local_1c8.data._M_elems[0xf] = 0;
        local_1c8.data._M_elems[0x10] = 0;
        local_1c8.data._M_elems[0x11] = 0;
        local_1c8.data._M_elems[0x12] = 0;
        local_1c8.data._M_elems[0x13] = 0;
        local_1c8.data._M_elems[0x14] = 0;
        local_1c8.data._M_elems[0x15] = 0;
        local_1c8.data._M_elems[0x16] = 0;
        local_1c8.data._M_elems[0x17] = 0;
        local_1c8.data._M_elems[0x18] = 0;
        local_1c8.data._M_elems[0x19] = 0;
        local_1c8.data._M_elems._104_5_ = 0;
        local_1c8.data._M_elems[0x1b]._1_3_ = 0;
        local_1c8.exp = 0;
        local_1c8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_1c8,0.0);
        iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_138,&local_1c8);
        if (0 < iVar9) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&(((this->
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->theShift).m_backend,
                     &(pVVar25->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_270].m_backend);
          pnVar11 = (pVVar25->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar18 = &local_b8;
          pnVar14 = pnVar11 + local_270;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pnVar14->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
            pnVar14 = (pointer)((long)pnVar14 + ((ulong)bVar27 * -2 + 1) * 4);
          }
          pnVar11[local_270].m_backend.exp = local_b8.exp;
          pnVar11[local_270].m_backend.neg = local_b8.neg;
          pnVar11[local_270].m_backend.fpclass = local_b8.fpclass;
          pnVar11[local_270].m_backend.prec_elem = local_b8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&(((this->
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->theShift).m_backend,
                     &(pVVar25->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_270].m_backend);
          return false;
        }
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&(((this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->theShift).m_backend,
                 &(pVVar26->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_270].m_backend);
      pnVar11 = (pVVar26->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar18 = &local_b8;
      pnVar14 = pnVar11 + local_270;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar14->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
        pnVar14 = (pointer)((long)pnVar14 + ((ulong)bVar27 * -2 + 1) * 4);
      }
      pnVar11[local_270].m_backend.exp = local_b8.exp;
      pnVar11[local_270].m_backend.neg = local_b8.neg;
      pnVar11[local_270].m_backend.fpclass = local_b8.fpclass;
      pnVar11[local_270].m_backend.prec_elem = local_b8.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                (&(((this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->theShift).m_backend,
                 &(pVVar26->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_270].m_backend);
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)sel,0.0);
    if (!polish) {
      if (((local_b8.fpclass == cpp_dec_float_NaN) ||
          (pnVar11 = (pVVar25->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
          pnVar11[local_270].m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_b8,&pnVar11[local_270].m_backend), iVar9 < 1)) {
        pcVar18 = &(pVVar26->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_270].m_backend;
        local_1c8.fpclass = cpp_dec_float_finite;
        local_1c8.prec_elem = 0x1c;
        local_1c8.data._M_elems[0] = 0;
        local_1c8.data._M_elems[1] = 0;
        local_1c8.data._M_elems[2] = 0;
        local_1c8.data._M_elems[3] = 0;
        local_1c8.data._M_elems[4] = 0;
        local_1c8.data._M_elems[5] = 0;
        local_1c8.data._M_elems[6] = 0;
        local_1c8.data._M_elems[7] = 0;
        local_1c8.data._M_elems[8] = 0;
        local_1c8.data._M_elems[9] = 0;
        local_1c8.data._M_elems[10] = 0;
        local_1c8.data._M_elems[0xb] = 0;
        local_1c8.data._M_elems[0xc] = 0;
        local_1c8.data._M_elems[0xd] = 0;
        local_1c8.data._M_elems[0xe] = 0;
        local_1c8.data._M_elems[0xf] = 0;
        local_1c8.data._M_elems[0x10] = 0;
        local_1c8.data._M_elems[0x11] = 0;
        local_1c8.data._M_elems[0x12] = 0;
        local_1c8.data._M_elems[0x13] = 0;
        local_1c8.data._M_elems[0x14] = 0;
        local_1c8.data._M_elems[0x15] = 0;
        local_1c8.data._M_elems[0x16] = 0;
        local_1c8.data._M_elems[0x17] = 0;
        local_1c8.data._M_elems[0x18] = 0;
        local_1c8.data._M_elems[0x19] = 0;
        local_1c8.data._M_elems._104_5_ = 0;
        local_1c8.data._M_elems[0x1b]._1_3_ = 0;
        local_1c8.exp = 0;
        local_1c8.neg = false;
        if (&local_1c8 != pcVar18) {
          pcVar19 = pcVar18;
          pcVar22 = &local_1c8;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pcVar22->data)._M_elems[0] = (pcVar19->data)._M_elems[0];
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar27 * -8 + 4);
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar27 * -8 + 4);
          }
          local_1c8.exp = pcVar18->exp;
          local_1c8.neg = pcVar18->neg;
          local_1c8.fpclass = pcVar18->fpclass;
          local_1c8.prec_elem = pcVar18->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_1c8,&local_b8);
        pSVar3 = (this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
      }
      else {
        pcVar18 = &(pVVar25->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_270].m_backend;
        local_1c8.fpclass = cpp_dec_float_finite;
        local_1c8.prec_elem = 0x1c;
        local_1c8.data._M_elems[0] = 0;
        local_1c8.data._M_elems[1] = 0;
        local_1c8.data._M_elems[2] = 0;
        local_1c8.data._M_elems[3] = 0;
        local_1c8.data._M_elems[4] = 0;
        local_1c8.data._M_elems[5] = 0;
        local_1c8.data._M_elems[6] = 0;
        local_1c8.data._M_elems[7] = 0;
        local_1c8.data._M_elems[8] = 0;
        local_1c8.data._M_elems[9] = 0;
        local_1c8.data._M_elems[10] = 0;
        local_1c8.data._M_elems[0xb] = 0;
        local_1c8.data._M_elems[0xc] = 0;
        local_1c8.data._M_elems[0xd] = 0;
        local_1c8.data._M_elems[0xe] = 0;
        local_1c8.data._M_elems[0xf] = 0;
        local_1c8.data._M_elems[0x10] = 0;
        local_1c8.data._M_elems[0x11] = 0;
        local_1c8.data._M_elems[0x12] = 0;
        local_1c8.data._M_elems[0x13] = 0;
        local_1c8.data._M_elems[0x14] = 0;
        local_1c8.data._M_elems[0x15] = 0;
        local_1c8.data._M_elems[0x16] = 0;
        local_1c8.data._M_elems[0x17] = 0;
        local_1c8.data._M_elems[0x18] = 0;
        local_1c8.data._M_elems[0x19] = 0;
        local_1c8.data._M_elems._104_5_ = 0;
        local_1c8.data._M_elems[0x1b]._1_3_ = 0;
        local_1c8.exp = 0;
        local_1c8.neg = false;
        if (&local_1c8 == pcVar18) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_1c8,&local_b8);
          if (local_1c8.data._M_elems[0] != 0 || local_1c8.fpclass != cpp_dec_float_finite) {
            local_1c8.neg = (bool)(local_1c8.neg ^ 1);
          }
        }
        else {
          pcVar19 = &local_b8;
          pcVar22 = &local_1c8;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pcVar22->data)._M_elems[0] = (pcVar19->data)._M_elems[0];
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar27 * -8 + 4);
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar27 * -8 + 4);
          }
          local_1c8.exp = local_b8.exp;
          local_1c8.neg = local_b8.neg;
          local_1c8.fpclass = local_b8.fpclass;
          local_1c8.prec_elem = local_b8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_1c8,pcVar18);
        }
        pSVar3 = (this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&(pSVar3->theShift).m_backend,&local_1c8);
      pnVar11 = (pVVar26->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar18 = &local_b8;
      pnVar14 = pnVar11 + local_270;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar14->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
        pnVar14 = (pointer)((long)pnVar14 + ((ulong)bVar27 * -2 + 1) * 4);
      }
      pnVar11[local_270].m_backend.exp = local_b8.exp;
      pnVar11[local_270].m_backend.neg = local_b8.neg;
      pnVar11[local_270].m_backend.fpclass = local_b8.fpclass;
      pnVar11[local_270].m_backend.prec_elem = local_b8.prec_elem;
      pnVar14 = (pVVar25->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar20 = pnVar11 + local_270;
      pnVar23 = pnVar14 + local_270;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar23->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
        pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar27 * -2 + 1) * 4);
        pnVar23 = (pointer)((long)pnVar23 + ((ulong)bVar27 * -2 + 1) * 4);
      }
      pnVar14[local_270].m_backend.exp = pnVar11[local_270].m_backend.exp;
      pnVar14[local_270].m_backend.neg = pnVar11[local_270].m_backend.neg;
      iVar29 = pnVar11[local_270].m_backend.prec_elem;
      pnVar14[local_270].m_backend.fpclass = pnVar11[local_270].m_backend.fpclass;
      pnVar14[local_270].m_backend.prec_elem = iVar29;
    }
  }
  return false;
}

Assistant:

bool SPxFastRT<R>::maxReEnter(R& sel,
                              R maxabs,
                              const SPxId& id,
                              int nr,
                              bool polish)
{
   R x, d;
   VectorBase<R>* up;
   VectorBase<R>* low;

   UpdateVector<R>& pvec = this->thesolver->pVec();
   SSVectorBase<R>& pupd = this->thesolver->pVec().delta();
   VectorBase<R>& upb = this->thesolver->upBound();
   VectorBase<R>& lpb = this->thesolver->lpBound();
   UpdateVector<R>& cvec = this->thesolver->coPvec();
   SSVectorBase<R>& cupd = this->thesolver->coPvec().delta();
   VectorBase<R>& ucb = this->thesolver->ucBound();
   VectorBase<R>& lcb = this->thesolver->lcBound();

   if(this->thesolver->isCoId(id))
   {
      if(this->thesolver->isCoBasic(nr))
      {
         cupd.clearIdx(nr);
         return true;
      }

      x = cvec[nr];
      d = cupd[nr];
      up = &ucb;
      low = &lcb;

      if(d < 0.0)
         sel = (lcb[nr] - cvec[nr]) / d;
      else
         sel = (ucb[nr] - cvec[nr]) / d;
   }
   else if(this->thesolver->isId(id))
   {
      pvec[nr] = this->thesolver->vector(nr) * cvec;

      if(this->thesolver->isBasic(nr))
      {
         pupd.clearIdx(nr);
         return true;
      }

      x = pvec[nr];
      d = pupd[nr];
      up = &upb;
      low = &lpb;

      if(d < 0.0)
         sel = (lpb[nr] - pvec[nr]) / d;
      else
         sel = (upb[nr] - pvec[nr]) / d;
   }
   else
      return true;

   if((*up)[nr] != (*low)[nr])
   {
      if(sel < -fastDelta / maxabs)
      {
         sel = 0.0;

         // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         if(!polish)
         {
            if(d > 0.0)
            {
               this->thesolver->theShift -= (*up)[nr];
               (*up)[nr] = x;
               this->thesolver->theShift += (*up)[nr];
            }
            else
            {
               this->thesolver->theShift += (*low)[nr];
               (*low)[nr] = x;
               this->thesolver->theShift -= (*low)[nr];
            }
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         if(x > (*up)[nr])
            this->thesolver->theShift += x - (*up)[nr];
         else
            this->thesolver->theShift += (*low)[nr] - x;

         (*up)[nr] = (*low)[nr] = x;
      }
   }

   return false;
}